

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

int __thiscall catalog::existTable(catalog *this,string *tableName)

{
  __type _Var1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (this->tableNumber <= lVar2) {
      return -1;
    }
    _Var1 = std::operator==(&(this->TableInfoList).
                             super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar2]->tableName,tableName);
    if (_Var1) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int catalog::existTable(std::string tableName){
    for(int i = 0 ; i < tableNumber ; i++){
        // std::cout << "check "<<tableName<<std::endl;
        // std::cout << "find "<<TableInfoList[i]->tableName<<std::endl;
        if(TableInfoList[i]->tableName == tableName){
            return i;
        }
    }
    return -1;
}